

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::DirectoryTreeStructureSignatureTask::provideValue
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key
          ,ValueType *valueData)

{
  pointer *ppSVar1;
  long *plVar2;
  char *pcVar3;
  Twine *pTVar4;
  Child *pCVar5;
  Child *pCVar6;
  pointer pSVar7;
  Child CVar8;
  Child CVar9;
  Child CVar10;
  bool bVar11;
  ulong uVar12;
  FileInfo *this_00;
  pointer pSVar13;
  undefined8 *puVar14;
  uintptr_t uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  Child *pCVar19;
  StringRef name;
  StringRef str;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filenames;
  BuildValue value;
  SmallString<256U> childPath;
  Child local_298;
  Child local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  Child CStack_280;
  Twine *local_278;
  Twine *pTStack_270;
  Twine *local_268;
  Twine *local_260;
  Child CStack_258;
  Twine *local_250;
  byte local_248;
  DirectoryTreeStructureSignatureTask *local_240;
  Child local_238;
  long local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  Child local_218;
  Twine *local_210;
  long local_208;
  ulong local_200;
  uintptr_t local_1f8;
  TaskInterface local_1f0;
  Twine local_1e0;
  BuildValue local_1c8;
  BinaryDecoder local_158 [11];
  Twine local_48;
  
  local_1f0.ctx = ti.ctx;
  local_1f0.impl = ti.impl;
  if (inputID == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directoryValue,valueData);
    local_158[0].data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_158[0].data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_158[0].data.Data;
    local_158[0].pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_1c8,local_158);
    if ((int)local_1c8.kind < 0xe) {
      if (local_1c8.kind == MissingInput) goto LAB_0019f7c1;
      if (local_1c8.kind != DirectoryContents) {
LAB_0019f22b:
        __assert_fail("value.isFilteredDirectoryContents() || value.isDirectoryContents()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                      ,0x5a4,
                      "virtual void (anonymous namespace)::DirectoryTreeStructureSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                     );
      }
    }
    else {
      if (local_1c8.kind == SkippedCommand) goto LAB_0019f7c1;
      if (local_1c8.kind != FilteredDirectoryContents) goto LAB_0019f22b;
    }
    llbuild::buildsystem::BuildValue::getDirectoryContents
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_218,&local_1c8);
    if (local_210 != local_218.twine) {
      uVar15 = 0;
      local_240 = this;
      do {
        local_158[0].data.Data = (char *)&local_158[0].pos;
        pcVar3 = (this->path)._M_dataplus._M_p;
        local_158[0].data.Length._0_4_ = 0;
        local_158[0].data.Length._4_4_ = 0x100;
        llvm::SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_158,pcVar3,pcVar3 + (this->path)._M_string_length)
        ;
        local_1f8 = uVar15;
        llvm::Twine::Twine((Twine *)&local_298,(StringRef *)(&(local_218.twine)->LHS + uVar15 * 2));
        llvm::Twine::Twine((Twine *)&local_238,"");
        llvm::Twine::Twine(&local_1e0,"");
        llvm::Twine::Twine(&local_48,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_158,(Twine *)&local_298,(Twine *)&local_238,
                   &local_1e0,&local_48);
        pTVar4 = (&(local_218.twine)->LHS)[uVar15 * 2].twine;
        if (pTVar4 == (Twine *)0x0) {
          local_298.twine = (Twine *)&local_288;
          local_290.twine = (Twine *)0x0;
          local_288 = 0;
        }
        else {
          local_298.twine = (Twine *)&local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,pTVar4,
                     (long)&pTVar4->LHS + (long)(&(local_218.twine)->RHS)[uVar15 * 2].twine);
        }
        this = local_240;
        local_248 = 0;
        local_278 = (Twine *)0x0;
        pTStack_270 = (Twine *)0x0;
        local_268 = (Twine *)0x0;
        pCVar5 = (Child *)(local_240->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar5 == (Child *)(local_240->childResults).
                               super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pCVar6 = (Child *)(local_240->childResults).
                            super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
          if ((long)pCVar5 - (long)pCVar6 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar17 = (long)pCVar5 - (long)pCVar6 >> 3;
          uVar18 = lVar17 * 0x2e8ba2e8ba2e8ba3;
          uVar12 = uVar18;
          if (pCVar5 == pCVar6) {
            uVar12 = 1;
          }
          local_200 = uVar12 + uVar18;
          if (0x1745d1745d1745c < local_200) {
            local_200 = 0x1745d1745d1745d;
          }
          if (CARRY8(uVar12,uVar18)) {
            local_200 = 0x1745d1745d1745d;
          }
          if (local_200 == 0) {
            pSVar13 = (pointer)0x0;
          }
          else {
            pSVar13 = (pointer)operator_new(local_200 * 0x58);
          }
          lVar17 = lVar17 * 8;
          pCVar19 = (Child *)((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                             lVar17 + -0x38);
          puVar14 = (undefined8 *)
                    ((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                    lVar17 + -0x38);
          *puVar14 = puVar14 + 2;
          if (local_298.twine == (Twine *)&local_288) {
            puVar14[2] = CONCAT71(uStack_287,local_288);
            *(Child *)(puVar14 + 3) = CStack_280;
          }
          else {
            pCVar19->twine = (Twine *)local_298;
            CVar10._1_7_ = uStack_287;
            CVar10.character = local_288;
            pCVar19[2] = CVar10;
          }
          pCVar19[1] = local_290;
          local_290.twine = (Twine *)0x0;
          local_288 = 0;
          pCVar19[4].twine = local_278;
          pCVar19[5].twine = pTStack_270;
          pCVar19[6].twine = local_268;
          local_268 = (Twine *)0x0;
          local_278 = (Twine *)0x0;
          pTStack_270 = (Twine *)0x0;
          pCVar19[10].character = local_248;
          if (local_248 == 1) {
            pCVar19[7].twine = local_260;
            pCVar19[8] = CStack_258;
            pCVar19[9].twine = local_250;
            local_260 = (Twine *)0x0;
            CStack_258.twine = (Twine *)0x0;
            local_250 = (Twine *)0x0;
          }
          pSVar7 = pSVar13;
          local_298.twine = (Twine *)&local_288;
          if (pCVar5 != pCVar6) {
            lVar17 = 0;
            do {
              lVar16 = lVar17;
              plVar2 = (long *)((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                               lVar16 + -0x38);
              *plVar2 = (long)(plVar2 + 2);
              plVar2 = (long *)((long)pCVar6 + lVar16);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)
                         ((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                         lVar16 + -0x38),*plVar2,plVar2[1] + *plVar2);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                         lVar16 + -0x18),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar2 + 4));
              lVar17 = plVar2[10];
              *(char *)((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                       lVar16 + 0x18) = (char)lVar17;
              if ((char)lVar17 == '\x01') {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&(pSVar13->directoryStructureSignatureValue).Storage.storage +
                           lVar16),(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   ((long)pCVar6 + lVar16 + 0x38));
              }
              lVar17 = lVar16 + 0x58;
              pCVar19 = pCVar6;
            } while ((Child *)(plVar2 + 0xb) != pCVar5);
            do {
              if ((bool)pCVar19[10].character == true) {
                pTVar4 = pCVar19[7].twine;
                if (pTVar4 != (Twine *)0x0) {
                  operator_delete(pTVar4,(long)pCVar19[9].twine - (long)pTVar4);
                }
                pCVar19[10].character = false;
              }
              pTVar4 = pCVar19[4].twine;
              if (pTVar4 != (Twine *)0x0) {
                operator_delete(pTVar4,(long)pCVar19[6].twine - (long)pTVar4);
              }
              if (pCVar19 + 2 != &pCVar19->twine->LHS) {
                operator_delete(&pCVar19->twine->LHS,(ulong)((long)&(pCVar19[2].twine)->LHS + 1));
              }
              pCVar19 = pCVar19 + 0xb;
            } while (pCVar19 != pCVar5);
            this = local_240;
            pSVar7 = (pointer)((long)&pSVar13[1].directoryStructureSignatureValue.Storage.storage +
                              lVar16 + -0x38);
          }
          if (pCVar6 != (Child *)0x0) {
            operator_delete(pCVar6,(long)(this->childResults).
                                         super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pCVar6);
          }
          (this->childResults).
          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar13;
          (this->childResults).
          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + 1;
          (this->childResults).
          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar13 + local_200;
        }
        else {
          pCVar5->twine = (Twine *)(pCVar5 + 2);
          if (local_298.twine == (Twine *)&local_288) {
            CVar9._1_7_ = uStack_287;
            CVar9.character = local_288;
            pCVar5[2] = CVar9;
            pCVar5[3] = CStack_280;
          }
          else {
            pCVar5->twine = (Twine *)local_298;
            CVar8._1_7_ = uStack_287;
            CVar8.character = local_288;
            pCVar5[2] = CVar8;
          }
          pCVar5[1] = local_290;
          local_290.twine = (Twine *)0x0;
          local_288 = 0;
          pCVar5[4].twine = (Twine *)0x0;
          pCVar5[5].twine = (Twine *)0x0;
          pCVar5[6].twine = (Twine *)0x0;
          local_268 = (Twine *)0x0;
          local_278 = (Twine *)0x0;
          pTStack_270 = (Twine *)0x0;
          pCVar5[10].character = false;
          ppSVar1 = &(local_240->childResults).
                     super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
          local_298.twine = (Twine *)&local_288;
        }
        uVar15 = local_1f8;
        if ((local_248 & 1) != 0) {
          if (local_260 != (Twine *)0x0) {
            operator_delete(local_260,(long)local_250 - (long)local_260);
          }
          local_248 = 0;
        }
        if (local_278 != (Twine *)0x0) {
          operator_delete(local_278,(long)local_268 - (long)local_278);
        }
        if (local_298.twine != (Twine *)&local_288) {
          operator_delete(local_298.twine,CONCAT71(uStack_287,local_288) + 1);
        }
        str.Length._0_4_ = (undefined4)local_158[0].data.Length;
        str.Data = local_158[0].data.Data;
        str.Length._4_4_ = 0;
        llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)&local_238,'N',str);
        local_298.twine = (Twine *)&local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_238.twine,(long)&(local_238.twine)->LHS + local_230);
        uVar15 = uVar15 + 1;
        llbuild::core::TaskInterface::request(&local_1f0,(KeyType *)&local_298,uVar15);
        if (local_298.twine != (Twine *)&local_288) {
          operator_delete(local_298.twine,CONCAT71(uStack_287,local_288) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.twine != &local_228) {
          operator_delete(local_238.twine,local_228._M_allocated_capacity + 1);
        }
        if ((uint64_t *)local_158[0].data.Data != &local_158[0].pos) {
          free(local_158[0].data.Data);
        }
      } while (uVar15 != (long)local_210 - (long)local_218 >> 4);
    }
    if (local_218.twine != (Twine *)0x0) {
      operator_delete(local_218.twine,local_208 - (long)local_218);
    }
  }
  else {
    pSVar13 = (this->childResults).
              super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = ((long)(this->childResults).
                    super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar13 >> 3) *
             0x2e8ba2e8ba2e8ba3;
    if (uVar12 + 1 <= inputID) {
      if (~uVar12 + inputID < uVar12) {
        llvm::optional_detail::
        OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::
        operator=(&pSVar13[~uVar12 + inputID].directoryStructureSignatureValue.Storage,valueData);
        return;
      }
      __assert_fail("index < childResults.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x5c7,
                    "virtual void (anonymous namespace)::DirectoryTreeStructureSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pSVar13[inputID - 1].value,valueData);
    local_158[0].data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_158[0].data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_158[0].data.Data;
    local_158[0].pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_1c8,local_158);
    if (local_1c8.kind == ExistingInput) {
      this_00 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_1c8);
      bVar11 = llbuild::basic::FileInfo::isDirectory(this_00);
      if (bVar11) {
        pcVar3 = (this->path)._M_dataplus._M_p;
        local_158[0].data.Data = (char *)&local_158[0].pos;
        local_158[0].data.Length._0_4_ = 0;
        local_158[0].data.Length._4_4_ = 0x100;
        llvm::SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_158,pcVar3,pcVar3 + (this->path)._M_string_length)
        ;
        llvm::Twine::Twine((Twine *)&local_298,&pSVar13[inputID - 1].filename);
        llvm::Twine::Twine((Twine *)&local_238,"");
        llvm::Twine::Twine((Twine *)&local_218,"");
        llvm::Twine::Twine(&local_1e0,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_158,(Twine *)&local_298,(Twine *)&local_238,
                   (Twine *)&local_218,&local_1e0);
        name.Length._0_4_ = (undefined4)local_158[0].data.Length;
        name.Data = local_158[0].data.Data;
        name.Length._4_4_ = 0;
        llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
                  ((BuildKey *)&local_238,'s',name,&this->filters);
        local_298.twine = (Twine *)&local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_238.twine,(long)&(local_238.twine)->LHS + local_230);
        llbuild::core::TaskInterface::request
                  (&local_1f0,(KeyType *)&local_298,
                   ((long)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 +
                   inputID);
        if (local_298.twine != (Twine *)&local_288) {
          operator_delete(local_298.twine,CONCAT71(uStack_287,local_288) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.twine != &local_228) {
          operator_delete(local_238.twine,local_228._M_allocated_capacity + 1);
        }
        if ((uint64_t *)local_158[0].data.Data != &local_158[0].pos) {
          free(local_158[0].data.Data);
        }
      }
    }
  }
LAB_0019f7c1:
  llbuild::buildsystem::BuildValue::~BuildValue(&local_1c8);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // The first input is the directory contents.
    if (inputID == 0) {
      // Record the value for the directory.
      directoryValue = valueData;

      // Request the inputs for each subpath.
      auto value = BuildValue::fromData(valueData);
      if (value.isMissingInput() || value.isSkippedCommand())
        return;

      assert(value.isFilteredDirectoryContents() || value.isDirectoryContents());
      auto filenames = value.getDirectoryContents();
      for (size_t i = 0; i != filenames.size(); ++i) {
        SmallString<256> childPath{ path };
        llvm::sys::path::append(childPath, filenames[i]);
        childResults.emplace_back(SubpathInfo{ filenames[i], {}, None });
        ti.request(BuildKey::makeNode(childPath).toData(), /*inputID=*/1 + i);
      }
      return;
    }

    // If the input is a child, add it to the collection and dispatch a
    // directory structure request if needed.
    if (inputID >= 1 && inputID < 1 + childResults.size()) {
      auto index = inputID - 1;
      auto& childResult = childResults[index];
      childResult.value = valueData;

      // If this node is a directory, request its signature recursively.
      auto value = BuildValue::fromData(valueData);
      if (value.isExistingInput()) {
        if (value.getOutputInfo().isDirectory()) {
          SmallString<256> childPath{ path };
          llvm::sys::path::append(childPath, childResult.filename);
        
          ti.request(
            BuildKey::makeDirectoryTreeStructureSignature(childPath, filters).toData(),
            /*inputID=*/1 + childResults.size() + index);
        }
      }
      return;
    }

    // Otherwise, the input should be a directory signature.
    auto index = inputID - 1 - childResults.size();
    assert(index < childResults.size());
    childResults[index].directoryStructureSignatureValue = valueData;
  }